

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  int iVar10;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  Float FVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar20 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar32;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float cd;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  SampledSpectrum SVar45;
  Vector3f local_d8;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  Vector3f local_b8;
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_3c;
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar42._4_60_ = wi._12_60_;
  auVar42._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._8_56_ = wi._8_56_;
  auVar41._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar38._4_60_ = wo._12_60_;
  auVar38._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._8_56_ = wo._8_56_;
  auVar27._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_98 = auVar38._0_16_;
  local_b8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27._0_16_);
  local_d8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar41._0_16_);
  auVar13 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  auVar15._0_12_ = ZEXT812(0);
  auVar15._12_4_ = 0;
  local_88._0_8_ = 0;
  auVar26._0_8_ = local_88._0_8_;
  local_88._0_8_ = 0;
  uVar9 = 0;
  if (0.001 <= auVar13._0_4_) {
    this_00 = &this->mfDistrib;
    local_58 = auVar38._0_4_ * auVar42._0_4_;
    local_a8 = auVar42._0_16_;
    local_d8.super_Tuple3<pbrt::Vector3,_float>.z = auVar42._0_4_;
    local_b8.super_Tuple3<pbrt::Vector3,_float>.z = auVar38._0_4_;
    local_88 = auVar15;
    if (local_58 <= 0.0) {
      if (((auVar38._0_4_ != 0.0) || (uVar9 = auVar26._0_8_, NAN(auVar38._0_4_))) &&
         ((auVar42._0_4_ != 0.0 || (uVar9 = auVar26._0_8_, NAN(auVar42._0_4_))))) {
        local_78 = ZEXT416((uint)this->eta);
        _fStack_c0 = 0;
        local_c8 = (undefined1  [8])local_d8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        _fStack_60 = 0;
        local_68 = (undefined1  [8])local_b8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        if ((f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
           (iVar10 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                          ::reg), iVar10 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                     f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                     StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg
                             );
        }
        auVar26._0_8_ = vcmpss_avx512f(local_98,ZEXT416(0),0xe);
        bVar1 = (bool)((byte)auVar26._0_8_ & 1);
        fVar11 = (float)((uint)bVar1 * local_78._0_4_ +
                        (uint)!bVar1 * (int)(1.0 / (float)local_78._0_4_));
        local_78 = ZEXT416((uint)fVar11);
        auVar14._0_4_ = fVar11 * (float)local_c8._0_4_ + (float)local_68._0_4_;
        auVar14._4_4_ = fVar11 * (float)local_c8._4_4_ + (float)local_68._4_4_;
        auVar14._8_4_ = fVar11 * fStack_c0 + fStack_60;
        auVar14._12_4_ = fVar11 * fStack_bc + fStack_5c;
        fVar11 = fVar11 * (float)local_a8._0_4_ + local_98._0_4_;
        auVar13._0_4_ = auVar14._0_4_ * auVar14._0_4_;
        auVar13._4_4_ = auVar14._4_4_ * auVar14._4_4_;
        auVar13._8_4_ = auVar14._8_4_ * auVar14._8_4_;
        auVar13._12_4_ = auVar14._12_4_ * auVar14._12_4_;
        auVar13 = vhaddps_avx(auVar13,auVar13);
        *(long *)(in_FS_OFFSET + -0x108) = *(long *)(in_FS_OFFSET + -0x108) + 1;
        fVar32 = fVar11 * fVar11 + auVar13._0_4_;
        if ((fVar32 != 0.0) || (NAN(fVar32))) {
          local_98 = auVar14;
          if (fVar32 < 0.0) {
            local_a8._0_4_ = fVar11;
            fVar32 = sqrtf(fVar32);
          }
          else {
            auVar13 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
            fVar32 = auVar13._0_4_;
            local_a8._0_4_ = fVar11;
          }
          local_a8._0_4_ = (float)local_a8._0_4_ / fVar32;
          auVar22._4_4_ = fVar32;
          auVar22._0_4_ = fVar32;
          auVar22._8_4_ = fVar32;
          auVar22._12_4_ = fVar32;
          auVar13 = vdivps_avx(local_98,auVar22);
          auVar15 = vmovshdup_avx(auVar13);
          auVar14 = ZEXT416(0) << 0x20;
          auVar15 = vfmadd213ss_fma(auVar15,auVar14,ZEXT416((uint)local_a8._0_4_));
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ +
                                                  ((float)local_a8._0_4_ - (float)local_a8._0_4_))),
                                    auVar13,auVar14);
          auVar43 = auVar13;
          if (auVar15._0_4_ < 0.0) {
            auVar43._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
            auVar43._8_4_ = auVar13._8_4_ ^ 0x80000000;
            auVar43._12_4_ = auVar13._12_4_ ^ 0x80000000;
          }
          local_98 = vmovshdup_avx(auVar43);
          auVar26._0_8_ = vcmpss_avx512f(auVar15,auVar14,1);
          bVar1 = (bool)((byte)auVar26._0_8_ & 1);
          local_a8 = ZEXT416((uint)bVar1 * (int)-(float)local_a8._0_4_ +
                             (uint)!bVar1 * local_a8._0_4_);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ *
                                                  local_d8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar43,ZEXT416((uint)local_d8.
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
          auVar13 = vfmadd231ss_fma(auVar13,local_a8,
                                    ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ *
                                                  local_b8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar43,ZEXT416((uint)local_b8.
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
          auVar15 = vfmadd231ss_fma(auVar15,local_a8,
                                    ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar26._0_8_ = 0;
          if (0.0 < auVar13._0_4_ * auVar15._0_4_) goto LAB_0039ed36;
          bVar4 = auVar15._0_4_ < -1.0;
          auVar14 = SUB6416(ZEXT464(0x3f800000),0);
          auVar13 = vminss_avx(auVar14,auVar15);
          fVar11 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar13._0_4_);
          bVar5 = 0.0 < fVar11;
          auVar3._8_4_ = 0x7fffffff;
          auVar3._0_8_ = 0x7fffffff7fffffff;
          auVar3._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx512vl(auVar15,auVar3);
          auVar26._0_8_ = vcmpss_avx512f(auVar14,auVar15,1);
          bVar1 = (bool)((byte)auVar26._0_8_ & 1);
          register0x00000900 = auVar13._4_12_;
          auVar15 = ZEXT416((uint)bVar5 * (int)this->eta + (uint)!bVar5 * (int)(1.0 / this->eta));
          local_68._0_4_ =
               (uint)bVar5 * (int)fVar11 +
               (uint)!bVar5 *
               ((uint)bVar4 * 0x3f800000 +
               (uint)!bVar4 * ((uint)bVar1 * 0x3f800000 + (uint)!bVar1 * auVar13._0_4_));
          auVar13 = vfnmadd213ss_fma(_local_68,_local_68,auVar14);
          auVar13 = vmaxss_avx(auVar13,ZEXT816(0));
          local_88 = auVar43;
          if (auVar13._0_4_ < 0.0) {
            _local_c8 = auVar15;
            auVar30._0_4_ = sqrtf(auVar13._0_4_);
            auVar30._4_60_ = extraout_var_01;
            auVar13 = auVar30._0_16_;
            auVar15 = _local_c8;
          }
          else {
            auVar13 = vsqrtss_avx(auVar13,auVar13);
          }
          fVar32 = local_98._0_4_;
          auVar34._0_4_ = auVar13._0_4_ / auVar15._0_4_;
          auVar34._4_12_ = auVar13._4_12_;
          fVar11 = 1.0;
          if (auVar34._0_4_ < 1.0) {
            auVar13 = vfnmadd213ss_fma(auVar34,auVar34,ZEXT416(0x3f800000));
            auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
            if (auVar13._0_4_ < 0.0) {
              _local_c8 = auVar15;
              auVar31._0_4_ = sqrtf(auVar13._0_4_);
              auVar31._4_60_ = extraout_var_02;
              auVar13 = auVar31._0_16_;
              auVar15 = _local_c8;
            }
            else {
              auVar13 = vsqrtss_avx(auVar13,auVar13);
            }
            fVar32 = local_98._0_4_;
            auVar43 = vfmsub213ss_fma(_local_68,auVar15,auVar13);
            auVar14 = vfmadd213ss_fma(_local_68,auVar15,auVar13);
            auVar36._0_4_ = auVar43._0_4_ / auVar14._0_4_;
            auVar36._4_12_ = auVar43._4_12_;
            auVar14 = vfnmadd213ss_fma(auVar13,auVar15,_local_68);
            auVar13 = vfmadd213ss_fma(auVar13,auVar15,_local_68);
            fVar11 = auVar14._0_4_ / auVar13._0_4_;
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar36,auVar36);
            fVar11 = auVar13._0_4_ * 0.5;
          }
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * local_b8.
                                                  super_Tuple3<pbrt::Vector3,_float>.y)),local_88,
                                    ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.x));
          auVar13 = vfmadd231ss_fma(auVar13,local_a8,
                                    ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * local_d8.
                                                  super_Tuple3<pbrt::Vector3,_float>.y)),local_88,
                                    ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.x));
          auVar15 = vfmadd231ss_fma(auVar15,local_a8,
                                    ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar13 = vfmadd213ss_fma(auVar15,local_78,auVar13);
          local_c8._0_4_ = auVar13._0_4_;
          fVar32 = 1.0 / local_78._0_4_;
          local_68._0_4_ =
               (float)((uint)(mode == Radiance) * (int)(fVar32 * fVar32) +
                      (uint)(mode != Radiance) * 0x3f800000) * (1.0 - fVar11);
          fVar11 = local_a8._0_4_ * local_a8._0_4_;
          fVar32 = 0.0;
          auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar11)),ZEXT816(0) << 0x40);
          fVar16 = auVar13._0_4_;
          if ((ABS(fVar16 / fVar11) != INFINITY) && (1e-16 <= fVar11 * fVar11)) {
            local_78._0_4_ = fVar16 / fVar11;
            local_38._0_4_ = fVar11 * fVar11;
            if (fVar16 < 0.0) {
              local_ac = fVar16;
              fVar11 = sqrtf(fVar16);
              auVar13 = ZEXT416((uint)local_ac);
            }
            else {
              auVar15 = vsqrtss_avx(auVar13,auVar13);
              fVar11 = auVar15._0_4_;
            }
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              auVar37._0_4_ = local_88._0_4_ / fVar11;
              auVar37._4_12_ = local_88._4_12_;
              auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar37);
              auVar26._0_8_ = vcmpss_avx512f(auVar37,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar1 = (bool)((byte)auVar26._0_8_ & 1);
              fVar11 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar15._0_4_);
            }
            else {
              fVar11 = 1.0;
            }
            fVar32 = this_00->alpha_x * this_00->alpha_x;
            if (auVar13._0_4_ < 0.0) {
              local_ac = fVar11 * fVar11;
              local_3c = fVar32;
              fVar16 = sqrtf(auVar13._0_4_);
              fVar11 = local_ac;
              fVar32 = local_3c;
            }
            else {
              auVar13 = vsqrtss_avx(auVar13,auVar13);
              fVar16 = auVar13._0_4_;
              fVar11 = fVar11 * fVar11;
            }
            fVar12 = 0.0;
            if ((fVar16 != 0.0) || (NAN(fVar16))) {
              auVar24._0_4_ = local_98._0_4_ / fVar16;
              auVar24._4_12_ = local_98._4_12_;
              auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
              auVar26._0_8_ = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar1 = (bool)((byte)auVar26._0_8_ & 1);
              fVar12 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar13._0_4_);
            }
            fVar16 = (this->mfDistrib).alpha_y;
            fVar11 = (fVar11 / fVar32 + (fVar12 * fVar12) / (fVar16 * fVar16)) *
                     (float)local_78._0_4_ + 1.0;
            fVar32 = 1.0 / (fVar16 * (this->mfDistrib).alpha_x * 3.1415927 * (float)local_38._0_4_ *
                           fVar11 * fVar11);
          }
          local_78._0_4_ = fVar32;
          FVar17 = TrowbridgeReitzDistribution::Lambda(this_00,&local_b8);
          local_38._0_4_ = FVar17;
          FVar17 = TrowbridgeReitzDistribution::Lambda(this_00,&local_d8);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ *
                                                  local_d8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    local_88,ZEXT416((uint)local_d8.
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
          auVar13 = vfmadd231ss_fma(auVar13,local_a8,
                                    ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar40._8_4_ = 0x7fffffff;
          auVar40._0_8_ = 0x7fffffff7fffffff;
          auVar40._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx(auVar13,auVar40);
          auVar15 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ *
                                                  local_b8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    local_88,ZEXT416((uint)local_b8.
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
          auVar15 = vfmadd231ss_fma(auVar15,local_a8,
                                    ZEXT416((uint)local_b8.super_Tuple3<pbrt::Vector3,_float>.z));
          auVar15 = vandps_avx(auVar15,auVar40);
          auVar25._0_4_ =
               ((1.0 / ((float)local_38._0_4_ + 1.0 + FVar17)) * (float)local_78._0_4_ *
                auVar13._0_4_ * auVar15._0_4_) /
               ((float)local_c8._0_4_ * (float)local_c8._0_4_ * local_58);
          auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar13 = vandps_avx(auVar25,auVar40);
          fVar11 = auVar13._0_4_ * (float)local_68._0_4_;
          goto LAB_0039f76b;
        }
        *(long *)(in_FS_OFFSET + -0x110) = *(long *)(in_FS_OFFSET + -0x110) + 1;
        uVar9 = local_88._0_8_;
      }
    }
    else if (((auVar38._0_4_ != 0.0) || (NAN(auVar38._0_4_))) &&
            ((auVar42._0_4_ != 0.0 || (uVar9 = auVar26._0_8_, NAN(auVar42._0_4_))))) {
      auVar39._0_4_ =
           (float)local_d8.super_Tuple3<pbrt::Vector3,_float>._0_8_ +
           (float)local_b8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar39._4_4_ =
           (float)((ulong)local_d8.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20) +
           (float)((ulong)local_b8.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      auVar39._8_8_ = 0;
      local_58 = auVar42._0_4_ + auVar38._0_4_;
      if ((auVar39._0_4_ == 0.0) && (auVar13 = vmovshdup_avx(auVar39), auVar13._0_4_ == 0.0)) {
        auVar26._0_8_ = 0;
        if ((local_58 == 0.0) && (!NAN(local_58))) goto LAB_0039ed36;
      }
      auVar18._0_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar18._4_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar18._8_8_ = 0;
      auVar13 = vhaddps_avx(auVar18,auVar18);
      fVar11 = local_58 * local_58 + auVar13._0_4_;
      if (fVar11 < 0.0) {
        local_88 = auVar39;
        fVar11 = sqrtf(fVar11);
        auVar39 = local_88;
      }
      else {
        auVar13 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
        fVar11 = auVar13._0_4_;
      }
      auVar15 = ZEXT816(0) << 0x40;
      local_58 = local_58 / fVar11;
      auVar19._4_4_ = fVar11;
      auVar19._0_4_ = fVar11;
      auVar19._8_4_ = fVar11;
      auVar19._12_4_ = fVar11;
      local_78 = vdivps_avx(auVar39,auVar19);
      local_38 = vmovshdup_avx(local_78);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(local_38._0_4_ * 0.0)),local_78,auVar15);
      fVar11 = local_58 + auVar13._0_4_;
      auVar20 = local_78;
      if (fVar11 < 0.0) {
        auVar20._0_8_ = local_78._0_8_ ^ 0x8000000080000000;
        auVar20._8_4_ = local_78._8_4_ ^ 0x80000000;
        auVar20._12_4_ = local_78._12_4_ ^ 0x80000000;
      }
      auVar26._0_8_ = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar15,1);
      bVar1 = (bool)((byte)auVar26._0_8_ & 1);
      auVar13 = vmovshdup_avx(auVar20);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ *
                                              local_d8.super_Tuple3<pbrt::Vector3,_float>.y)),
                                auVar20,ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.x)
                               );
      auVar14 = vfmadd231ss_fma(auVar13,ZEXT416((uint)bVar1 * (int)-local_58 +
                                                (uint)!bVar1 * (int)local_58),
                                ZEXT416((uint)local_d8.super_Tuple3<pbrt::Vector3,_float>.z));
      bVar4 = auVar14._0_4_ < -1.0;
      auVar43 = SUB6416(ZEXT464(0x3f800000),0);
      auVar13 = vminss_avx(auVar43,auVar14);
      fVar11 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * auVar13._0_4_);
      bVar5 = 0.0 < fVar11;
      auVar2._8_4_ = 0x7fffffff;
      auVar2._0_8_ = 0x7fffffff7fffffff;
      auVar2._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(auVar14,auVar2);
      auVar26._0_8_ = vcmpss_avx512f(auVar43,auVar14,1);
      bVar1 = (bool)((byte)auVar26._0_8_ & 1);
      register0x00000900 = auVar13._4_12_;
      auVar14 = ZEXT416((uint)bVar5 * (int)this->eta + (uint)!bVar5 * (int)(1.0 / this->eta));
      local_68._0_4_ =
           (uint)bVar5 * (int)fVar11 +
           (uint)!bVar5 *
           ((uint)bVar4 * 0x3f800000 +
           (uint)!bVar4 * ((uint)bVar1 * 0x3f800000 + (uint)!bVar1 * auVar13._0_4_));
      auVar13 = vfnmadd213ss_fma(_local_68,_local_68,auVar43);
      auVar13 = vmaxss_avx(auVar13,auVar15);
      if (auVar13._0_4_ < 0.0) {
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        _local_c8 = auVar14;
        auVar28._0_4_ = sqrtf(auVar13._0_4_);
        auVar28._4_60_ = extraout_var;
        auVar13 = auVar28._0_16_;
        auVar14 = _local_c8;
        uVar6 = uStack_54;
        uVar7 = uStack_50;
        uVar8 = uStack_4c;
      }
      else {
        auVar13 = vsqrtss_avx(auVar13,auVar13);
        uVar6 = 0;
        uVar7 = 0;
        uVar8 = 0;
      }
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      fVar11 = 1.0;
      local_88 = vandps_avx(auVar44,local_98);
      local_98 = vandps_avx(auVar44,local_a8);
      auVar21._0_4_ = auVar13._0_4_ / auVar14._0_4_;
      auVar21._4_12_ = auVar13._4_12_;
      if (auVar21._0_4_ < 1.0) {
        auVar13 = vfnmadd213ss_fma(auVar21,auVar21,ZEXT416(0x3f800000));
        auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x20);
        if (auVar13._0_4_ < 0.0) {
          _local_c8 = auVar14;
          uStack_54 = uVar6;
          uStack_50 = uVar7;
          uStack_4c = uVar8;
          auVar29._0_4_ = sqrtf(auVar13._0_4_);
          auVar29._4_60_ = extraout_var_00;
          auVar13 = auVar29._0_16_;
          auVar14 = _local_c8;
        }
        else {
          auVar13 = vsqrtss_avx(auVar13,auVar13);
        }
        auVar43 = vfmsub213ss_fma(_local_68,auVar14,auVar13);
        auVar15 = vfmadd213ss_fma(_local_68,auVar14,auVar13);
        auVar33._0_4_ = auVar43._0_4_ / auVar15._0_4_;
        auVar33._4_12_ = auVar43._4_12_;
        auVar15 = vfnmadd213ss_fma(auVar13,auVar14,_local_68);
        auVar13 = vfmadd213ss_fma(auVar13,auVar14,_local_68);
        fVar11 = auVar15._0_4_ / auVar13._0_4_;
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar33,auVar33);
        fVar11 = auVar13._0_4_ * 0.5;
      }
      fVar32 = local_58 * local_58;
      auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar32)),ZEXT816(0) << 0x40);
      fVar16 = auVar13._0_4_;
      local_58 = fVar16 / fVar32;
      local_a8._0_4_ = fVar11;
      fVar11 = 0.0;
      if ((ABS(local_58) != INFINITY) && (1e-16 <= fVar32 * fVar32)) {
        local_c8._0_4_ = fVar32 * fVar32;
        if (fVar16 < 0.0) {
          local_68._0_4_ = fVar16;
          fVar11 = sqrtf(fVar16);
          auVar13 = ZEXT416((uint)local_68._0_4_);
        }
        else {
          auVar15 = vsqrtss_avx(auVar13,auVar13);
          fVar11 = auVar15._0_4_;
        }
        if ((fVar11 != 0.0) || (NAN(fVar11))) {
          auVar35._0_4_ = local_78._0_4_ / fVar11;
          auVar35._4_12_ = local_78._4_12_;
          auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar35);
          auVar26._0_8_ = vcmpss_avx512f(auVar35,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar1 = (bool)((byte)auVar26._0_8_ & 1);
          fVar11 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar15._0_4_);
        }
        else {
          fVar11 = 1.0;
        }
        fVar32 = this_00->alpha_x * this_00->alpha_x;
        if (auVar13._0_4_ < 0.0) {
          local_68._0_4_ = fVar11 * fVar11;
          local_78._0_4_ = fVar32;
          fVar16 = sqrtf(auVar13._0_4_);
          fVar11 = (float)local_68._0_4_;
          fVar32 = (float)local_78._0_4_;
        }
        else {
          auVar13 = vsqrtss_avx(auVar13,auVar13);
          fVar16 = auVar13._0_4_;
          fVar11 = fVar11 * fVar11;
        }
        fVar12 = 0.0;
        if ((fVar16 != 0.0) || (NAN(fVar16))) {
          auVar23._0_4_ = local_38._0_4_ / fVar16;
          auVar23._4_12_ = local_38._4_12_;
          auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23);
          auVar26._0_8_ = vcmpss_avx512f(auVar23,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar1 = (bool)((byte)auVar26._0_8_ & 1);
          fVar12 = (float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar13._0_4_);
        }
        fVar16 = (this->mfDistrib).alpha_y;
        fVar11 = local_58 * (fVar11 / fVar32 + (fVar12 * fVar12) / (fVar16 * fVar16)) + 1.0;
        fVar11 = 1.0 / ((float)local_c8._0_4_ * fVar16 * (this->mfDistrib).alpha_x * 3.1415927 *
                       fVar11 * fVar11);
      }
      local_58 = fVar11;
      FVar17 = TrowbridgeReitzDistribution::Lambda(this_00,&local_b8);
      local_c8._0_4_ = FVar17;
      FVar17 = TrowbridgeReitzDistribution::Lambda(this_00,&local_d8);
      fVar11 = ((1.0 / ((float)local_c8._0_4_ + 1.0 + FVar17)) * local_58 * (float)local_a8._0_4_) /
               ((float)local_98._0_4_ * 4.0 * (float)local_88._0_4_);
LAB_0039f76b:
      auVar26._0_8_ =
           CONCAT44(fVar11 * (this->tint).values.values[1],fVar11 * (this->tint).values.values[0]);
      auVar26._8_4_ = fVar11 * (this->tint).values.values[2];
      auVar26._12_4_ = fVar11 * (this->tint).values.values[3];
      auVar13 = vshufpd_avx(auVar26,auVar26,1);
      local_88._0_8_ = auVar13._0_8_;
      goto LAB_0039ed36;
    }
  }
  local_88._0_8_ = uVar9;
  auVar26._0_8_ = 0;
LAB_0039ed36:
  SVar45.values.values[2] = (float)local_88._0_4_;
  SVar45.values.values[3] = (float)local_88._4_4_;
  SVar45.values.values[0] = (float)(int)auVar26._0_8_;
  SVar45.values.values[1] = (float)(int)((ulong)auVar26._0_8_ >> 0x20);
  return (SampledSpectrum)SVar45.values.values;
}

Assistant:

SampledSpectrum DielectricInterfaceBxDF::f(Vector3f wo, Vector3f wi,
                                           TransportMode mode) const {
    if (mfDistrib.EffectivelySmooth())
        return SampledSpectrum(0);
    if (SameHemisphere(wo, wi)) {
        // Compute reflection at non-delta dielectric interface
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return SampledSpectrum(0.);
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return SampledSpectrum(0.);
        wh = Normalize(wh);
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        return tint * SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                      (4 * cosTheta_i * cosTheta_o));

    } else {
        // Compute transmission at non-delta dielectric interface
        Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return {};
        wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

        // Return no transmission if _wi_ and _wo_ are on the same side of _wh_
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return {};

        // Evaluate BTDF for transmission through microfacet interface
        Float F = FrDielectric(Dot(wo, wh), eta);
        Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
        Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
        return tint *
               SampledSpectrum((1 - F) * factor *
                               std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                        AbsDot(wi, wh) * AbsDot(wo, wh) /
                                        (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
    }
}